

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstalledFile.cxx
# Opt level: O2

void __thiscall cmInstalledFile::Property::~Property(Property *this)

{
  cmDeleteAll<std::vector<cmCompiledGeneratorExpression*,std::allocator<cmCompiledGeneratorExpression*>>>
            (&this->ValueExpressions);
  std::
  _Vector_base<cmCompiledGeneratorExpression_*,_std::allocator<cmCompiledGeneratorExpression_*>_>::
  ~_Vector_base((_Vector_base<cmCompiledGeneratorExpression_*,_std::allocator<cmCompiledGeneratorExpression_*>_>
                 *)this);
  return;
}

Assistant:

cmInstalledFile::Property::~Property()
{
  cmDeleteAll(this->ValueExpressions);
}